

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLengthen.cpp
# Opt level: O0

int CmdLengthen(CLI *cli,Rules *rules,Database *database,Journal *journal)

{
  bool bVar1;
  bool bVar2;
  string *this;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  string *psVar6;
  time_t delta;
  ostream *poVar7;
  string local_238;
  undefined1 local_212;
  allocator<char> local_211;
  string local_210;
  Interval *local_1f0;
  Interval *interval_1;
  iterator __end1;
  iterator __begin1;
  vector<Interval,_std::allocator<Interval>_> *__range1;
  string local_1c8;
  reference local_1a8;
  Interval *interval;
  iterator __end3;
  iterator __begin3;
  vector<Interval,_std::allocator<Interval>_> *__range3;
  bool found;
  int *id;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  vector<Interval,_std::allocator<Interval>_> intervals;
  undefined1 local_118 [8];
  IntervalFilterAllWithIds filtering;
  Duration dur;
  undefined1 local_98 [8];
  set<int,_std::less<int>,_std::allocator<int>_> ids;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  Journal *pJStack_28;
  bool verbose;
  Journal *journal_local;
  Database *database_local;
  Rules *rules_local;
  CLI *cli_local;
  
  pJStack_28 = journal;
  journal_local = (Journal *)database;
  database_local = (Database *)rules;
  rules_local = (Rules *)cli;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"verbose",&local_51);
  bVar1 = Rules::getBoolean(rules,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = bVar1;
  CLI::getIds((set<int,_std::less<int>,_std::allocator<int>_> *)local_98,(CLI *)rules_local);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  if (bVar1) {
    dur._period._6_1_ = 1;
    this = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,"IDs must be specified. See \'timew help lengthen\'.",
               (allocator<char> *)((long)&dur._period + 7));
    dur._period._6_1_ = 0;
    __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  CLI::getDuration((Duration *)&filtering._id_end,(CLI *)rules_local);
  Journal::startTransaction(pJStack_28);
  flattenDatabase((Database *)journal_local,(Rules *)database_local);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  IntervalFilterAllWithIds::IntervalFilterAllWithIds
            ((IntervalFilterAllWithIds *)local_118,
             (set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &intervals.super__Vector_base<Interval,_std::allocator<Interval>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  getTracked((vector<Interval,_std::allocator<Interval>_> *)&__range2,(Database *)journal_local,
             (Rules *)database_local,(IntervalFilter *)local_118);
  sVar3 = std::vector<Interval,_std::allocator<Interval>_>::size
                    ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
  if (sVar3 != sVar4) {
    __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    id = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&id), bVar1) {
      piVar5 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
      bVar1 = false;
      __end3 = std::vector<Interval,_std::allocator<Interval>_>::begin
                         ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      interval = (Interval *)
                 std::vector<Interval,_std::allocator<Interval>_>::end
                           ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                         *)&interval), bVar2) {
        local_1a8 = __gnu_cxx::
                    __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                    ::operator*(&__end3);
        if (local_1a8->id == *piVar5) {
          bVar1 = true;
          break;
        }
        __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
        ::operator++(&__end3);
      }
      if (!bVar1) {
        __range1._6_1_ = 1;
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"ID \'@{1}\' does not correspond to any tracking.",
                   (allocator<char> *)((long)&__range1 + 7));
        format<int>(psVar6,&local_1c8,*piVar5);
        __range1._6_1_ = 0;
        __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      std::_Rb_tree_const_iterator<int>::operator++(&__end2);
    }
  }
  __end1 = std::vector<Interval,_std::allocator<Interval>_>::begin
                     ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  interval_1 = (Interval *)
               std::vector<Interval,_std::allocator<Interval>_>::end
                         ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>
                                *)&interval_1);
    if (!bVar1) {
      Journal::endTransaction(pJStack_28);
      std::vector<Interval,_std::allocator<Interval>_>::~vector
                ((vector<Interval,_std::allocator<Interval>_> *)&__range2);
      IntervalFilterAllWithIds::~IntervalFilterAllWithIds((IntervalFilterAllWithIds *)local_118);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
      return 0;
    }
    local_1f0 = __gnu_cxx::
                __normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
                operator*(&__end1);
    bVar1 = Range::is_open(&local_1f0->super_Range);
    if (bVar1) break;
    Database::deleteInterval((Database *)journal_local,local_1f0);
    delta = Duration::toTime_t((Duration *)&filtering._id_end);
    Datetime::operator+=(&(local_1f0->super_Range).end,delta);
    validate((CLI *)rules_local,(Rules *)database_local,(Database *)journal_local,local_1f0);
    Database::addInterval((Database *)journal_local,local_1f0,(bool)(local_29 & 1));
    if ((local_29 & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"Lengthened @");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1f0->id);
      poVar7 = std::operator<<(poVar7," by ");
      Duration::formatHours_abi_cxx11_(&local_238,(Duration *)&filtering._id_end);
      poVar7 = std::operator<<(poVar7,(string *)&local_238);
      std::operator<<(poVar7,'\n');
      std::__cxx11::string::~string((string *)&local_238);
    }
    __gnu_cxx::__normal_iterator<Interval_*,_std::vector<Interval,_std::allocator<Interval>_>_>::
    operator++(&__end1);
  }
  local_212 = 1;
  psVar6 = (string *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"Cannot lengthen open interval @{1}",&local_211);
  format<int>(psVar6,&local_210,local_1f0->id);
  local_212 = 0;
  __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int CmdLengthen (
  CLI& cli,
  Rules& rules,
  Database& database,
  Journal& journal)
{
  const bool verbose = rules.getBoolean ("verbose");

  auto ids = cli.getIds ();

  if (ids.empty ())
  {
    throw std::string ("IDs must be specified. See 'timew help lengthen'.");
  }

  auto dur = cli.getDuration ();

  journal.startTransaction ();

  flattenDatabase (database, rules);
  auto filtering = IntervalFilterAllWithIds (ids);
  auto intervals = getTracked (database, rules, filtering);

  if (intervals.size () != ids.size ())
  {
    for (auto& id: ids)
    {
      bool found = false;

      for (auto& interval: intervals)
      {
        if (interval.id == id)
        {
          found = true;
          break;
        }
      }
      if (! found)
      {
        throw format ("ID '@{1}' does not correspond to any tracking.", id);
      }
    }
  }

  // Lengthen intervals specified by ids
  for (auto& interval : intervals)
  {
    if (interval.is_open ())
    {
      throw format ("Cannot lengthen open interval @{1}", interval.id);
    }

    database.deleteInterval (interval);

    interval.end += dur.toTime_t ();
    validate (cli, rules, database, interval);
    database.addInterval (interval, verbose);

    if (verbose)
    {
      std::cout << "Lengthened @" << interval.id << " by " << dur.formatHours () << '\n';
    }
  }

  journal.endTransaction ();

  return 0;
}